

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederate.cpp
# Opt level: O3

void __thiscall helics::MessageFederate::~MessageFederate(MessageFederate *this)

{
  this->_vptr_MessageFederate = (_func_int **)0x4bacd0;
  *(undefined8 *)&this->field_0x10 = 0x4bad98;
  std::
  unique_ptr<helics::MessageFederateManager,_std::default_delete<helics::MessageFederateManager>_>::
  ~unique_ptr(&this->mfManager);
  Federate::~Federate((Federate *)&this->field_0x10);
  operator_delete(this,0x1a8);
  return;
}

Assistant:

void MessageFederate::loadFederateData()
{
    mfManager = std::make_unique<MessageFederateManager>(coreObject.get(),
                                                         this,
                                                         getID(),
                                                         singleThreadFederate);
    if (!configFile.empty()) {
        MessageFederate::registerMessageInterfaces(configFile);
    }
}